

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

size_t adios2::utils::relative_to_absolute_step<unsigned_long>
                 (Engine *fp,Variable<unsigned_long> *variable,size_t relstep)

{
  unsigned_long uVar1;
  size_t *psVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  size_t step;
  size_t absstep;
  const_iterator itStep;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *indices;
  size_t Step;
  MinVarInfo *minBlocks;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this;
  size_t local_48;
  size_t local_8;
  
  psVar2 = (size_t *)(**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI,in_RDX);
  if (psVar2 == (size_t *)0x0) {
    std::
    map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::begin(in_stack_ffffffffffffffa8);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator->(in_stack_ffffffffffffffb0);
    uVar1 = ppVar3->first;
    for (this = (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)0x0; local_48 = uVar1 - 1, this < in_RDX;
        this = (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)((long)&this->_M_node + 1)) {
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator++(this);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator->(this);
      uVar1 = ppVar3->first;
    }
    local_8 = local_48;
  }
  else {
    local_8 = *psVar2;
    if (psVar2 != (size_t *)0x0) {
      MinVarInfo::~MinVarInfo((MinVarInfo *)0x1b0c2a);
      operator_delete(psVar2);
    }
  }
  return local_8;
}

Assistant:

size_t relative_to_absolute_step(core::Engine *fp, core::Variable<T> *variable,
                                 const size_t relstep)
{
    auto minBlocks = fp->MinBlocksInfo(*variable, relstep);

    if (minBlocks)
    {
        size_t Step = minBlocks->Step;
        delete minBlocks;
        return Step;
    }

    const std::map<size_t, std::vector<size_t>> &indices =
        variable->m_AvailableStepBlockIndexOffsets;
    auto itStep = indices.begin();
    size_t absstep = itStep->first - 1;

    for (size_t step = 0; step < relstep; step++)
    {
        ++itStep;
        absstep = itStep->first - 1;
    }
    return absstep;
}